

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void glcts::prepareDataForColorFloatTexture
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLint n_elements,GLint n_mipmap_levels,GLenum texture_format,GLenum texture_type,
               GLsizei texture_width,GLsizei texture_height)

{
  GLfloat components [4];
  
  components[0] = (float)(mipmap_level + 1) / (float)n_mipmap_levels;
  components[1] = (float)(cube_face + 1) / 6.0;
  components[2] = (float)(element_index + 1) / (float)n_elements;
  components[3] = 0.25;
  prepareDataForTexture<float,4u>
            (gl,cube_face,element_index,mipmap_level,texture_format,texture_type,texture_width,
             texture_height,components);
  return;
}

Assistant:

void prepareDataForColorFloatTexture(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
									 glw::GLint mipmap_level, glw::GLint n_elements, glw::GLint n_mipmap_levels,
									 glw::GLenum texture_format, glw::GLenum texture_type, glw::GLsizei texture_width,
									 glw::GLsizei texture_height)
{
	glw::GLfloat components[4];

	getColorFloatComponents(cube_face, element_index, mipmap_level, n_elements, n_mipmap_levels, components);

	prepareDataForTexture<glw::GLfloat, 4>(gl, cube_face, element_index, mipmap_level, texture_format, texture_type,
										   texture_width, texture_height, components);
}